

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

pair<long,_long> get_thread_range(ggml_compute_params *params,ggml_tensor *src0)

{
  undefined8 in_RSI;
  int *in_RDI;
  int64_t ir1;
  int64_t ir0;
  int64_t dr;
  int64_t nr;
  int64_t nth;
  int64_t ith;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  pair<long,_long> local_10;
  
  local_28 = (long)*in_RDI;
  local_30 = (long)in_RDI[1];
  local_38 = ggml_nrows(in_RSI);
  local_40 = (local_38 + local_30 + -1) / local_30;
  local_48 = local_40 * local_28;
  local_58 = local_38;
  if (local_48 + local_40 < local_38) {
    local_58 = local_48 + local_40;
  }
  local_50 = local_58;
  std::pair<long,_long>::pair<long,_long,_true>(&local_10,&local_48,&local_50);
  return local_10;
}

Assistant:

static std::pair<int64_t, int64_t> get_thread_range(const struct ggml_compute_params * params, const struct ggml_tensor * src0) {
    const int64_t ith = params->ith;
    const int64_t nth = params->nth;

    const int64_t nr  = ggml_nrows(src0);

    // rows per thread
    const int64_t dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int64_t ir0 = dr*ith;
    const int64_t ir1 = MIN(ir0 + dr, nr);

    return {ir0, ir1};
}